

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

bool __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_Interfaces(RTPUDPv6Transmitter *this)

{
  short *psVar1;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  list<in6_addr,_std::allocator<in6_addr>_> *this_00;
  long *plVar2;
  ifaddrs *addrs;
  long local_18;
  
  local_18 = CONCAT71(in_register_00000001,in_AL);
  plVar2 = &local_18;
  getifaddrs(&local_18);
  this_00 = &this->localIPs;
  while (plVar2 = (long *)*plVar2, plVar2 != (long *)0x0) {
    psVar1 = (short *)plVar2[3];
    if ((psVar1 != (short *)0x0) && (*psVar1 == 10)) {
      std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
                (this_00,(value_type *)(psVar1 + 4));
    }
  }
  freeifaddrs(local_18);
  return (this_00->super__List_base<in6_addr,_std::allocator<in6_addr>_>)._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)this_00;
}

Assistant:

bool RTPUDPv6Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET6)
		{
			struct sockaddr_in6 *inaddr = (struct sockaddr_in6 *)tmp->ifa_addr;
			localIPs.push_back(inaddr->sin6_addr);
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}